

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::GraphicsPipeline>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  Environment *this;
  VkAllocationCallbacks **this_00;
  RefData<vk::Handle<(vk::HandleType)18>_> data;
  RefData<vk::Handle<(vk::HandleType)18>_> data_00;
  RefData<vk::Handle<(vk::HandleType)18>_> data_01;
  RefData<vk::Handle<(vk::HandleType)18>_> data_02;
  allocator<char> local_2f9;
  string local_2f8;
  Move<vk::Handle<(vk::HandleType)18>_> local_2d8;
  RefData<vk::Handle<(vk::HandleType)18>_> local_2b8;
  undefined1 local_298 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> obj3;
  RefData<vk::Handle<(vk::HandleType)18>_> local_258;
  undefined1 local_238 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> obj2;
  RefData<vk::Handle<(vk::HandleType)18>_> local_1f8;
  undefined1 local_1d8 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> obj1;
  Move<vk::Handle<(vk::HandleType)18>_> local_1a8;
  RefData<vk::Handle<(vk::HandleType)18>_> local_188;
  undefined1 local_168 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> obj0;
  Resources res;
  Environment env;
  Context *context_local;
  TestStatus *local_10;
  
  this = (Environment *)
         &res.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.
          m_allocator;
  local_10 = __return_storage_ptr__;
  Environment::Environment(this,context,4);
  this_00 = &obj0.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  GraphicsPipeline::Resources::Resources
            ((Resources *)this_00,this,(Parameters *)((long)&context_local + 7));
  GraphicsPipeline::create
            (&local_1a8,this,(Resources *)this_00,(Parameters *)((long)&context_local + 7));
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_188,(Move *)&local_1a8);
  data.deleter.m_deviceIface = local_188.deleter.m_deviceIface;
  data.object.m_internal = local_188.object.m_internal;
  data.deleter.m_device = local_188.deleter.m_device;
  data.deleter.m_allocator = local_188.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_168,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_1a8);
  GraphicsPipeline::create
            ((Move<vk::Handle<(vk::HandleType)18>_> *)
             &obj2.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator,
             (Environment *)
             &res.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter
              .m_allocator,
             (Resources *)
             &obj0.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator,
             (Parameters *)((long)&context_local + 7));
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_1f8,
             (Move *)&obj2.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
            );
  data_00.deleter.m_deviceIface = local_1f8.deleter.m_deviceIface;
  data_00.object.m_internal = local_1f8.object.m_internal;
  data_00.deleter.m_device = local_1f8.deleter.m_device;
  data_00.deleter.m_allocator = local_1f8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_1d8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)18>_> *)
             &obj2.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator);
  GraphicsPipeline::create
            ((Move<vk::Handle<(vk::HandleType)18>_> *)
             &obj3.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator,
             (Environment *)
             &res.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter
              .m_allocator,
             (Resources *)
             &obj0.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator,
             (Parameters *)((long)&context_local + 7));
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_258,
             (Move *)&obj3.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
            );
  data_01.deleter.m_deviceIface = local_258.deleter.m_deviceIface;
  data_01.object.m_internal = local_258.object.m_internal;
  data_01.deleter.m_device = local_258.deleter.m_device;
  data_01.deleter.m_allocator = local_258.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_238,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)18>_> *)
             &obj3.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator);
  GraphicsPipeline::create
            (&local_2d8,
             (Environment *)
             &res.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter
              .m_allocator,
             (Resources *)
             &obj0.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator,
             (Parameters *)((long)&context_local + 7));
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2b8,(Move *)&local_2d8);
  data_02.deleter.m_deviceIface = local_2b8.deleter.m_deviceIface;
  data_02.object.m_internal = local_2b8.object.m_internal;
  data_02.deleter.m_device = local_2b8.deleter.m_device;
  data_02.deleter.m_allocator = local_2b8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_298,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_2d8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_298);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_238);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_1d8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"Ok",&local_2f9);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  GraphicsPipeline::Resources::~Resources
            ((Resources *)
             &obj0.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}